

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

bool ON_Internal_RemoveCommonFactors(double rel_zero_tol,double factor,double *x,double *y)

{
  undefined1 in_AL;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = *x;
  if (((dVar1 <= 0.0) || (rel_zero_tol <= 0.0)) || (dVar2 = *y, dVar2 <= 0.0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x563,"","Invalid input parameters.");
    return (bool)extraout_AL;
  }
  if ((((rel_zero_tol != 1.0) || (NAN(rel_zero_tol))) &&
      ((dVar1 < 4503599627370496.0 &&
       ((dVar2 < 4503599627370496.0 && (dVar1 * 1e-14 < rel_zero_tol)))))) &&
     (dVar2 * 1e-14 < rel_zero_tol)) {
    while( true ) {
      dVar1 = ON_InternalQuotient(1e-14,dVar1,rel_zero_tol);
      dVar2 = floor(dVar1);
      in_AL = extraout_AL_00;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      dVar2 = ON_InternalQuotient(1e-14,*y,rel_zero_tol);
      dVar3 = floor(dVar2);
      if (dVar2 != dVar3) {
        return (bool)extraout_AL_01;
      }
      if (NAN(dVar2) || NAN(dVar3)) {
        return (bool)extraout_AL_01;
      }
      if (1.0 <= rel_zero_tol) {
        if (*x <= dVar1) {
          return (bool)extraout_AL_01;
        }
        if (*y <= dVar2) {
          return (bool)extraout_AL_01;
        }
      }
      *x = dVar1;
      *y = dVar2;
      if (rel_zero_tol < 2.0) {
        return (bool)extraout_AL_01;
      }
      if (dVar2 < rel_zero_tol * 0.9999999999999991) {
        return (bool)extraout_AL_01;
      }
      dVar1 = *x;
      if (dVar1 < rel_zero_tol * 0.9999999999999991) {
        return (bool)extraout_AL_01;
      }
    }
  }
  return (bool)in_AL;
}

Assistant:

static bool ON_Internal_RemoveCommonFactors(const double rel_zero_tol, const double factor, double& x, double& y)
{
  if (false == (x > 0.0 && y > 0.0 && factor > 0.0 && rel_zero_tol >= 0.0 && rel_zero_tol < 0.01))
  {
    ON_ERROR("Invalid input parameters.");
    return false;
  }
  if (1.0 == factor)
    return true; // nothing to do

  if (!(x < 1.0 / ON_EPSILON && y < 1.0 / ON_EPSILON))
  {
    // x or y is too big for this code to work with IEEE double arithmetic.
    return false;
  }

  const double fat_eps = 4.0*ON_EPSILON;
  const double factor_tol = (rel_zero_tol > fat_eps) ? rel_zero_tol : fat_eps;
  if (!(factor > x*factor_tol && factor > y*factor_tol))
  {
    // factor is too small for the ON_ScaleValue context where this
    // function is designed to be used.
    return false;
  }

  bool rc = false;
  for (;;)
  {
    const double s = ON_InternalQuotient(factor_tol,x,factor);
    if (!(s == floor(s)))
      break;


    const double t = ON_InternalQuotient(factor_tol,y,factor);
    if (!(t == floor(t)))
      break;
    
    if (factor >= 1.0)
    {
      if (!(s < x && t < y))
        break;
    }

    rc = true;
    x = s;
    y = t;

    if ( !(factor >= 2.0 && x >= factor*(1.0-fat_eps) && y >= factor*(1.0-fat_eps)) )
      break;
  }

  return rc;
}